

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grammar.cpp
# Opt level: O1

token_t __thiscall grammar::get_nonterminal(grammar *this,symbol_t *symbol)

{
  _Rb_tree_header *p_Var1;
  undefined4 uVar2;
  bool bVar3;
  token_t tVar4;
  undefined8 in_RAX;
  _Rb_tree_node_base *p_Var5;
  string *psVar6;
  token_t to_ret;
  undefined8 uStack_28;
  
  p_Var5 = (this->symbols)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->symbols)._M_t._M_impl.super__Rb_tree_header;
  uStack_28 = in_RAX;
  uVar2 = (int)in_RAX;
  while (uStack_28._0_4_ = uVar2, (_Rb_tree_header *)p_Var5 != p_Var1) {
    bVar3 = operator==((this_t *)&p_Var5[1]._M_parent,symbol);
    if (bVar3) break;
    p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    uVar2 = (undefined4)uStack_28;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    tVar4 = next_nonterminal(this);
    uStack_28 = CONCAT44(tVar4.internal_rep,(undefined4)uStack_28);
    psVar6 = (string *)
             std::
             map<strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>,_std::less<strong_t<int,_grammar::token_tag>_>,_std::allocator<std::pair<const_strong_t<int,_grammar::token_tag>,_strong_t<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_grammar::symbol_tag>_>_>_>
             ::operator[](&this->symbols,(key_type *)((long)&uStack_28 + 4));
    std::__cxx11::string::_M_assign(psVar6);
  }
  else {
    uStack_28 = (ulong)p_Var5[1]._M_color << 0x20;
  }
  return (token_t)uStack_28._4_4_;
}

Assistant:

token_t grammar::get_nonterminal(const symbol_t & symbol) {
    const auto iter = std::find_if(
        symbols.begin(), symbols.end(),
        [&symbol](const auto & item) { return item.second == symbol; });
    if (iter != symbols.end()) {
        return iter->first;
    } else {
        const auto to_ret = next_nonterminal();
        symbols[to_ret]   = symbol;
        // Rules are added in the parser / manually
        return to_ret;
    }
}